

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncCastEmulation.cpp
# Opt level: O0

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::ParallelFuncCastEmulation::create(ParallelFuncCastEmulation *this)

{
  long in_RSI;
  unique_ptr<wasm::ParallelFuncCastEmulation,_std::default_delete<wasm::ParallelFuncCastEmulation>_>
  local_20 [2];
  ParallelFuncCastEmulation *this_local;
  
  this_local = this;
  std::make_unique<wasm::ParallelFuncCastEmulation,wasm::HeapType&,unsigned_int&>
            ((HeapType *)local_20,(uint *)(in_RSI + 0x130));
  std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>::
  unique_ptr<wasm::ParallelFuncCastEmulation,std::default_delete<wasm::ParallelFuncCastEmulation>,void>
            ((unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>> *)this,local_20);
  std::
  unique_ptr<wasm::ParallelFuncCastEmulation,_std::default_delete<wasm::ParallelFuncCastEmulation>_>
  ::~unique_ptr(local_20);
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<ParallelFuncCastEmulation>(ABIType, numParams);
  }